

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiKeyChord GetMergedModsFromKeys(void)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  
  bVar2 = ImGui::IsKeyDown(ImGuiKey_ModCtrl);
  bVar3 = ImGui::IsKeyDown(ImGuiKey_ModShift);
  uVar4 = (uint)bVar2 * 0x1000 + 0x2000;
  if (!bVar3) {
    uVar4 = (uint)bVar2 * 0x1000;
  }
  bVar2 = ImGui::IsKeyDown(ImGuiKey_ModAlt);
  uVar1 = uVar4 + 0x4000;
  if (!bVar2) {
    uVar1 = uVar4;
  }
  bVar2 = ImGui::IsKeyDown(ImGuiKey_ModSuper);
  uVar4 = uVar1 | 0x8000;
  if (!bVar2) {
    uVar4 = uVar1;
  }
  return uVar4;
}

Assistant:

static ImGuiKeyChord GetMergedModsFromKeys()
{
    ImGuiKeyChord mods = 0;
    if (ImGui::IsKeyDown(ImGuiMod_Ctrl))     { mods |= ImGuiMod_Ctrl; }
    if (ImGui::IsKeyDown(ImGuiMod_Shift))    { mods |= ImGuiMod_Shift; }
    if (ImGui::IsKeyDown(ImGuiMod_Alt))      { mods |= ImGuiMod_Alt; }
    if (ImGui::IsKeyDown(ImGuiMod_Super))    { mods |= ImGuiMod_Super; }
    return mods;
}